

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O0

DNA * __thiscall Population::mutation(DNA *__return_storage_ptr__,Population *this,DNA *dna)

{
  undefined4 uVar1;
  bool bVar2;
  reference __in;
  type *ptVar3;
  type *this_00;
  reference __in_00;
  type *this_01;
  reference pCVar4;
  Room *pRVar5;
  Teacher *pTVar6;
  Subject *pSVar7;
  double dVar8;
  Class *class_;
  iterator __end3;
  iterator __begin3;
  type *__range3;
  type *listOfClasses;
  type *day;
  _Self local_70;
  iterator __end2;
  iterator __begin2;
  type *__range2;
  type *schedulePerGroup;
  type *group;
  _Self local_40;
  iterator __end1;
  iterator __begin1;
  map<Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
  *__range1;
  map<Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
  *schedule;
  DNA *dna_local;
  Population *this_local;
  
  __end1 = std::
           map<Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
           ::begin((map<Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
                    *)dna);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
       ::end((map<Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
              *)dna);
  while( true ) {
    bVar2 = std::operator!=(&__end1,&local_40);
    if (!bVar2) break;
    __in = std::
           _Rb_tree_iterator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>
           ::operator*(&__end1);
    ptVar3 = std::
             get<0ul,Group_const,std::map<std::__cxx11::string,std::vector<Class,std::allocator<Class>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<Class,std::allocator<Class>>>>>>
                       (__in);
    this_00 = std::
              get<1ul,Group_const,std::map<std::__cxx11::string,std::vector<Class,std::allocator<Class>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<Class,std::allocator<Class>>>>>>
                        (__in);
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>
             ::begin(this_00);
    local_70._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>
         ::end(this_00);
    while( true ) {
      bVar2 = std::operator!=(&__end2,&local_70);
      if (!bVar2) break;
      __in_00 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>
                ::operator*(&__end2);
      std::get<0ul,std::__cxx11::string_const,std::vector<Class,std::allocator<Class>>>(__in_00);
      this_01 = std::get<1ul,std::__cxx11::string_const,std::vector<Class,std::allocator<Class>>>
                          (__in_00);
      __end3 = std::vector<Class,_std::allocator<Class>_>::begin(this_01);
      class_ = (Class *)std::vector<Class,_std::allocator<Class>_>::end(this_01);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<Class_*,_std::vector<Class,_std::allocator<Class>_>_>
                                    *)&class_);
        if (!bVar2) break;
        pCVar4 = __gnu_cxx::__normal_iterator<Class_*,_std::vector<Class,_std::allocator<Class>_>_>
                 ::operator*(&__end3);
        dVar8 = RandomProbability();
        if (dVar8 < this->mutationRate_) {
          pRVar5 = Schedule::GetRandomRoom(this->data_->rooms,ptVar3->size);
          uVar1 = *(undefined4 *)&pRVar5->field_0x4;
          (pCVar4->room).number = pRVar5->number;
          *(undefined4 *)&(pCVar4->room).field_0x4 = uVar1;
          (pCVar4->room).capacity = pRVar5->capacity;
        }
        dVar8 = RandomProbability();
        if (dVar8 < this->mutationRate_) {
          pTVar6 = GetRandom<Teacher>(&(pCVar4->subject).teachers);
          Teacher::operator=(&pCVar4->teacher,pTVar6);
        }
        dVar8 = RandomProbability();
        if (dVar8 < this->mutationRate_) {
          pSVar7 = GetRandom<Subject>(&ptVar3->subjects);
          Subject::operator=(&pCVar4->subject,pSVar7);
          pTVar6 = GetRandom<Teacher>(&(pCVar4->subject).teachers);
          Teacher::operator=(&pCVar4->teacher,pTVar6);
        }
        __gnu_cxx::__normal_iterator<Class_*,_std::vector<Class,_std::allocator<Class>_>_>::
        operator++(&__end3);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>
      ::operator++(&__end2);
    }
    std::
    _Rb_tree_iterator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>
    ::operator++(&__end1);
  }
  DNA::DNA(__return_storage_ptr__,dna);
  return __return_storage_ptr__;
}

Assistant:

DNA Population::mutation(DNA dna) const {
    auto& schedule = dna.schedule.schedule;
    for (auto&[group, schedulePerGroup] : schedule) {
        for (auto&[day, listOfClasses] : schedulePerGroup) {
            for (Class& class_ : listOfClasses) {
                if (RandomProbability() < mutationRate_) {
                    class_.room = Schedule::GetRandomRoom(data_.rooms, group.size);
                }
                if (RandomProbability() < mutationRate_) {
                    class_.teacher = GetRandom(class_.subject.teachers);
                }
                if (RandomProbability() < mutationRate_) {
                    class_.subject = GetRandom(group.subjects);
                    class_.teacher = GetRandom(class_.subject.teachers);
                }
            }
        }
    }
    return dna;
}